

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O2

lzma_ret stream_encode(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                      size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action
                      )

{
  uint8_t *out_00;
  lzma_ret lVar1;
  lzma_vli unpadded_size;
  lzma_stream_flags stream_flags;
  
  out_00 = (uint8_t *)((long)coder_ptr + 0x1d0);
  do {
    if (out_size <= *out_pos) {
      return LZMA_OK;
    }
    switch(*coder_ptr) {
    case 0:
    case 2:
    case 5:
      lzma_bufcpy(out_00,(size_t *)((long)coder_ptr + 0x1c0),*(size_t *)((long)coder_ptr + 0x1c8),
                  out,out_pos,out_size);
      if (*(ulong *)((long)coder_ptr + 0x1c0) < *(ulong *)((long)coder_ptr + 0x1c8)) {
        return LZMA_OK;
      }
      if (*coder_ptr == 5) {
        return LZMA_STREAM_END;
      }
      *(undefined8 *)((long)coder_ptr + 0x1c0) = 0;
      *(int *)coder_ptr = *coder_ptr + 1;
      break;
    case 1:
      if (*in_pos == in_size) {
        if (action != LZMA_FINISH) {
          return (uint)(action != LZMA_RUN);
        }
        lVar1 = lzma_index_encoder_init
                          ((lzma_next_coder *)((long)coder_ptr + 0x170),allocator,
                           *(lzma_index **)((long)coder_ptr + 0x1b8));
        if (lVar1 != LZMA_OK) {
          return lVar1;
        }
        *(undefined4 *)coder_ptr = 4;
      }
      else {
        if ((*(char *)((long)coder_ptr + 4) == '\0') &&
           (lVar1 = block_encoder_init((lzma_stream_coder_conflict *)coder_ptr,allocator),
           lVar1 != LZMA_OK)) {
          return lVar1;
        }
        *(undefined1 *)((long)coder_ptr + 4) = 0;
        lVar1 = lzma_block_header_encode((lzma_block *)((long)coder_ptr + 0x50),out_00);
        if (lVar1 != LZMA_OK) {
          return LZMA_PROG_ERROR;
        }
        *(ulong *)((long)coder_ptr + 0x1c8) = (ulong)*(uint *)((long)coder_ptr + 0x54);
        *(undefined4 *)coder_ptr = 2;
      }
      break;
    case 3:
      lVar1 = (**(code **)((long)coder_ptr + 0x20))
                        (*(undefined8 *)((long)coder_ptr + 8),allocator,in,in_pos,in_size,out,
                         out_pos,out_size,stream_encode::convert[action]);
      if (action == LZMA_SYNC_FLUSH) {
        return lVar1;
      }
      if (lVar1 != LZMA_STREAM_END) {
        return lVar1;
      }
      unpadded_size = lzma_block_unpadded_size((lzma_block *)((long)coder_ptr + 0x50));
      if (unpadded_size == 0) {
        __assert_fail("unpadded_size != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder.c"
                      ,0xa9,
                      "lzma_ret stream_encode(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                     );
      }
      lVar1 = lzma_index_append(*(lzma_index **)((long)coder_ptr + 0x1b8),allocator,unpadded_size,
                                *(lzma_vli *)((long)coder_ptr + 0x68));
      if (lVar1 != LZMA_OK) {
        return lVar1;
      }
      *(undefined4 *)coder_ptr = 1;
      break;
    case 4:
      lVar1 = (**(code **)((long)coder_ptr + 0x188))
                        (*(undefined8 *)((long)coder_ptr + 0x170),allocator,0,0,0,out,out_pos,
                         out_size,0);
      if (lVar1 != LZMA_STREAM_END) {
        return lVar1;
      }
      stream_flags.reserved_enum4 = LZMA_RESERVED_ENUM;
      stream_flags.reserved_bool1 = '\0';
      stream_flags.reserved_bool2 = '\0';
      stream_flags.reserved_bool3 = '\0';
      stream_flags.reserved_bool4 = '\0';
      stream_flags.reserved_bool5 = '\0';
      stream_flags.reserved_bool6 = '\0';
      stream_flags.reserved_bool7 = '\0';
      stream_flags.reserved_bool8 = '\0';
      stream_flags.reserved_int1 = 0;
      stream_flags.check = LZMA_CHECK_NONE;
      stream_flags.reserved_enum1 = LZMA_RESERVED_ENUM;
      stream_flags.reserved_enum2 = LZMA_RESERVED_ENUM;
      stream_flags.reserved_enum3 = LZMA_RESERVED_ENUM;
      stream_flags.version = 0;
      stream_flags._4_4_ = 0;
      stream_flags.backward_size = 0;
      stream_flags.reserved_int2 = 0;
      stream_flags._52_4_ = 0;
      stream_flags.backward_size = lzma_index_size(*(lzma_index **)((long)coder_ptr + 0x1b8));
      stream_flags.check = *(lzma_check *)((long)coder_ptr + 0x58);
      lVar1 = lzma_stream_footer_encode(&stream_flags,out_00);
      if (lVar1 != LZMA_OK) {
        return LZMA_PROG_ERROR;
      }
      *(undefined8 *)((long)coder_ptr + 0x1c8) = 0xc;
      *(undefined4 *)coder_ptr = 5;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder.c"
                    ,0xcd,
                    "lzma_ret stream_encode(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                   );
    }
  } while( true );
}

Assistant:

static lzma_ret
stream_encode(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	lzma_stream_coder *coder = coder_ptr;

	// Main loop
	while (*out_pos < out_size)
	switch (coder->sequence) {
	case SEQ_STREAM_HEADER:
	case SEQ_BLOCK_HEADER:
	case SEQ_STREAM_FOOTER:
		lzma_bufcpy(coder->buffer, &coder->buffer_pos,
				coder->buffer_size, out, out_pos, out_size);
		if (coder->buffer_pos < coder->buffer_size)
			return LZMA_OK;

		if (coder->sequence == SEQ_STREAM_FOOTER)
			return LZMA_STREAM_END;

		coder->buffer_pos = 0;
		++coder->sequence;
		break;

	case SEQ_BLOCK_INIT: {
		if (*in_pos == in_size) {
			// If we are requested to flush or finish the current
			// Block, return LZMA_STREAM_END immediately since
			// there's nothing to do.
			if (action != LZMA_FINISH)
				return action == LZMA_RUN
						? LZMA_OK : LZMA_STREAM_END;

			// The application had used LZMA_FULL_FLUSH to finish
			// the previous Block, but now wants to finish without
			// encoding new data, or it is simply creating an
			// empty Stream with no Blocks.
			//
			// Initialize the Index encoder, and continue to
			// actually encoding the Index.
			return_if_error(lzma_index_encoder_init(
					&coder->index_encoder, allocator,
					coder->index));
			coder->sequence = SEQ_INDEX_ENCODE;
			break;
		}

		// Initialize the Block encoder unless it was already
		// initialized by stream_encoder_init() or
		// stream_encoder_update().
		if (!coder->block_encoder_is_initialized)
			return_if_error(block_encoder_init(coder, allocator));

		// Make it false so that we don't skip the initialization
		// with the next Block.
		coder->block_encoder_is_initialized = false;

		// Encode the Block Header. This shouldn't fail since we have
		// already initialized the Block encoder.
		if (lzma_block_header_encode(&coder->block_options,
				coder->buffer) != LZMA_OK)
			return LZMA_PROG_ERROR;

		coder->buffer_size = coder->block_options.header_size;
		coder->sequence = SEQ_BLOCK_HEADER;
		break;
	}

	case SEQ_BLOCK_ENCODE: {
		static const lzma_action convert[LZMA_ACTION_MAX + 1] = {
			LZMA_RUN,
			LZMA_SYNC_FLUSH,
			LZMA_FINISH,
			LZMA_FINISH,
			LZMA_FINISH,
		};

		const lzma_ret ret = coder->block_encoder.code(
				coder->block_encoder.coder, allocator,
				in, in_pos, in_size,
				out, out_pos, out_size, convert[action]);
		if (ret != LZMA_STREAM_END || action == LZMA_SYNC_FLUSH)
			return ret;

		// Add a new Index Record.
		const lzma_vli unpadded_size = lzma_block_unpadded_size(
				&coder->block_options);
		assert(unpadded_size != 0);
		return_if_error(lzma_index_append(coder->index, allocator,
				unpadded_size,
				coder->block_options.uncompressed_size));

		coder->sequence = SEQ_BLOCK_INIT;
		break;
	}

	case SEQ_INDEX_ENCODE: {
		// Call the Index encoder. It doesn't take any input, so
		// those pointers can be NULL.
		const lzma_ret ret = coder->index_encoder.code(
				coder->index_encoder.coder, allocator,
				NULL, NULL, 0,
				out, out_pos, out_size, LZMA_RUN);
		if (ret != LZMA_STREAM_END)
			return ret;

		// Encode the Stream Footer into coder->buffer.
		const lzma_stream_flags stream_flags = {
			.version = 0,
			.backward_size = lzma_index_size(coder->index),
			.check = coder->block_options.check,
		};

		if (lzma_stream_footer_encode(&stream_flags, coder->buffer)
				!= LZMA_OK)
			return LZMA_PROG_ERROR;

		coder->buffer_size = LZMA_STREAM_HEADER_SIZE;
		coder->sequence = SEQ_STREAM_FOOTER;
		break;
	}

	default:
		assert(0);
		return LZMA_PROG_ERROR;
	}

	return LZMA_OK;
}